

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearSystem.cpp
# Opt level: O2

void __thiscall
iDynTree::optimalcontrol::LinearSystem::LinearSystem
          (LinearSystem *this,size_t stateSize,size_t controlSize)

{
  LinearSystemPimpl *this_00;
  MatrixDynSize *pMVar1;
  shared_ptr<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>_> tempControl;
  shared_ptr<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>_> tempState;
  __shared_ptr<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2>
  local_40;
  __shared_ptr<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2>
  local_30;
  
  DynamicalSystem::DynamicalSystem(&this->super_DynamicalSystem,stateSize,controlSize);
  (this->super_DynamicalSystem)._vptr_DynamicalSystem = (_func_int **)&PTR__LinearSystem_001d3808;
  this_00 = (LinearSystemPimpl *)operator_new(0xf8);
  memset(this_00,0,0xf8);
  LinearSystemPimpl::LinearSystemPimpl(this_00);
  this->m_pimpl = this_00;
  this_00->hasStateSparsity = false;
  this_00->hasControlSparsity = false;
  std::make_shared<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>>();
  pMVar1 = TimeInvariantObject<iDynTree::MatrixDynSize>::get(local_30._M_ptr);
  iDynTree::MatrixDynSize::resize((ulong)pMVar1,stateSize & 0xffffffff);
  TimeInvariantObject<iDynTree::MatrixDynSize>::get(local_30._M_ptr);
  iDynTree::MatrixDynSize::zero();
  std::
  __shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,(__gnu_cxx::_Lock_policy)2>
  ::operator=((__shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,(__gnu_cxx::_Lock_policy)2>
               *)this->m_pimpl,&local_30);
  std::make_shared<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>>();
  pMVar1 = TimeInvariantObject<iDynTree::MatrixDynSize>::get(local_40._M_ptr);
  iDynTree::MatrixDynSize::resize((ulong)pMVar1,stateSize & 0xffffffff);
  TimeInvariantObject<iDynTree::MatrixDynSize>::get(local_40._M_ptr);
  iDynTree::MatrixDynSize::zero();
  std::
  __shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,(__gnu_cxx::_Lock_policy)2>
  ::operator=((__shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,(__gnu_cxx::_Lock_policy)2>
               *)&this->m_pimpl->controlMatrix,&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  return;
}

Assistant:

LinearSystem::LinearSystem(size_t stateSize,
                                   size_t controlSize)
        : DynamicalSystem(stateSize, controlSize)
        , m_pimpl(new LinearSystemPimpl())
        {
            assert(m_pimpl);
            m_pimpl->hasStateSparsity = false;
            m_pimpl->hasControlSparsity = false;
            std::shared_ptr<TimeInvariantMatrix> tempState = std::make_shared<TimeInvariantMatrix>();
            tempState->get().resize(static_cast<unsigned int>(stateSize), static_cast<unsigned int>(stateSize));
            tempState->get().zero();
            m_pimpl->stateMatrix = tempState;

            std::shared_ptr<TimeInvariantMatrix> tempControl = std::make_shared<TimeInvariantMatrix>();
            tempControl->get().resize(static_cast<unsigned int>(stateSize), static_cast<unsigned int>(controlSize));
            tempControl->get().zero();
            m_pimpl->controlMatrix = tempControl;
        }